

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

Maybe<kj::Array<char>_> *
kj::parse::Many_<const_kj::parse::CharGroup__&,_false>::
Impl<capnp::compiler::Lexer::ParserInput,_char>::apply
          (Maybe<kj::Array<char>_> *__return_storage_ptr__,CharGroup_ *subParser,ParserInput *input)

{
  byte bVar1;
  size_t newSize;
  byte *pbVar2;
  byte *pbVar3;
  Vector<char> local_58;
  
  local_58.builder.ptr = (char *)0x0;
  local_58.builder.pos = (RemoveConst<char> *)0x0;
  local_58.builder.endPtr = (char *)0x0;
  local_58.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  pbVar3 = (byte *)(input->super_IteratorInput<char,_const_char_*>).pos;
  if (pbVar3 != (byte *)(input->super_IteratorInput<char,_const_char_*>).end) {
    do {
      bVar1 = *pbVar3;
      if ((subParser->bits[bVar1 >> 6] >> ((ulong)bVar1 & 0x3f) & 1) == 0) {
        pbVar2 = (byte *)(input->super_IteratorInput<char,_const_char_*>).best;
        if (pbVar2 < pbVar3) {
          pbVar2 = pbVar3;
        }
        (input->super_IteratorInput<char,_const_char_*>).best = (char *)pbVar2;
        break;
      }
      pbVar3 = pbVar3 + 1;
      (input->super_IteratorInput<char,_const_char_*>).pos = (char *)pbVar3;
      if (local_58.builder.pos == local_58.builder.endPtr) {
        newSize = ((long)local_58.builder.pos - (long)local_58.builder.ptr) * 2;
        if (local_58.builder.pos == local_58.builder.ptr) {
          newSize = 4;
        }
        Vector<char>::setCapacity(&local_58,newSize);
      }
      *local_58.builder.pos = bVar1;
      local_58.builder.pos = local_58.builder.pos + 1;
      pbVar2 = (byte *)(input->super_IteratorInput<char,_const_char_*>).best;
      if (pbVar2 < pbVar3) {
        pbVar2 = pbVar3;
      }
      pbVar3 = (byte *)(input->super_IteratorInput<char,_const_char_*>).pos;
      (input->super_IteratorInput<char,_const_char_*>).best = (char *)pbVar2;
    } while (pbVar3 != (byte *)(input->super_IteratorInput<char,_const_char_*>).end);
  }
  if (local_58.builder.pos != local_58.builder.endPtr) {
    Vector<char>::setCapacity(&local_58,(long)local_58.builder.pos - (long)local_58.builder.ptr);
  }
  (__return_storage_ptr__->ptr).isSet = true;
  (__return_storage_ptr__->ptr).field_1.value.ptr = local_58.builder.ptr;
  (__return_storage_ptr__->ptr).field_1.value.size_ =
       (long)local_58.builder.pos - (long)local_58.builder.ptr;
  (__return_storage_ptr__->ptr).field_1.value.disposer = local_58.builder.disposer;
  return __return_storage_ptr__;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_SOME(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(subResult));
      } else {
        break;
      }
    }